

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O1

int __thiscall
GEO::geofile::import_plane_surface
          (geofile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *split_string_vector,string *import_path,int *line_number)

{
  pointer pbVar1;
  pointer pbVar2;
  char *pcVar3;
  bool bVar4;
  ostream *poVar5;
  int *piVar6;
  undefined8 uVar7;
  int iVar8;
  pointer n;
  bool bVar9;
  double dVar10;
  double dVar11;
  pair<const_int,_int> local_40;
  int *local_38;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(split_string_vector,
             (split_string_vector->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(split_string_vector,
             (split_string_vector->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish + -1);
  pbVar1 = (split_string_vector->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (split_string_vector->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 != pbVar2) {
    bVar9 = true;
    n = pbVar1;
    local_38 = line_number;
    do {
      bVar4 = is_integer(n);
      piVar6 = local_38;
      if (!bVar4) {
        bVar9 = false;
      }
      n = n + 1;
    } while (n != pbVar2);
    if (!bVar9) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error: Invalid value (line ",0x1b);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," of ",4);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(import_path->_M_dataplus)._M_p,import_path->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      return 1;
    }
  }
  pcVar3 = (pbVar1->_M_dataplus)._M_p;
  piVar6 = __errno_location();
  iVar8 = *piVar6;
  *piVar6 = 0;
  dVar10 = strtod(pcVar3,(char **)&local_40);
  if ((char *)CONCAT44(local_40.second,local_40.first) == pcVar3) {
    std::__throw_invalid_argument("stod");
    goto LAB_0012ceb6;
  }
  if (*piVar6 == 0) {
LAB_0012ce35:
    *piVar6 = iVar8;
  }
  else if (*piVar6 == 0x22) {
    std::__throw_out_of_range("stod");
    goto LAB_0012ce35;
  }
  pcVar3 = pbVar1[1]._M_dataplus._M_p;
  iVar8 = *piVar6;
  *piVar6 = 0;
  dVar11 = strtod(pcVar3,(char **)&local_40);
  if ((char *)CONCAT44(local_40.second,local_40.first) == pcVar3) {
LAB_0012ceb6:
    uVar7 = std::__throw_invalid_argument("stod");
    if (*piVar6 == 0) {
      *piVar6 = iVar8;
    }
    _Unwind_Resume(uVar7);
  }
  if (*piVar6 != 0) {
    if (*piVar6 != 0x22) goto LAB_0012ce77;
    dVar11 = (double)std::__throw_out_of_range("stod");
  }
  *piVar6 = iVar8;
LAB_0012ce77:
  local_40.first = (int)dVar10;
  local_40.second = (int)dVar11;
  std::
  _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              *)&this->plane_surfaces_map,&local_40);
  return 0;
}

Assistant:

int GEO::geofile::import_plane_surface( std::vector<std::string> &split_string_vector,
                                std::string &import_path,
                                int &line_number)
{
    auto it = split_string_vector.begin();
    split_string_vector.erase(it);
    it = std::prev(split_string_vector.end(),1);
    split_string_vector.erase(it);
    it = split_string_vector.begin();
    bool proceed = true;
    auto ssv_end = split_string_vector.end();
    while (it!=ssv_end)
    {
        if (!is_integer(*it)) proceed = false;
        it++;
    }
    if (proceed==false)
    {
        std::cout << "Error: Invalid value (line "
        << line_number << " of "
        << import_path << ")" << std::endl;
        return EXIT_FAILURE;
    }
    it = split_string_vector.begin();
    int key = std::stod(*it);
    it++;
    plane_surfaces_map.insert({key,std::stod(*it)});
    return EXIT_SUCCESS;
}